

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::
RegisterTests(ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest> *this)

{
  ParamNameGeneratorFunc *pPVar1;
  TestMetaFactoryBase<std::tuple<void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>
  *pTVar2;
  _Alloc_hider test_suite_name_00;
  char *value_param;
  _Alloc_hider name;
  byte bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  pointer __lhs;
  undefined4 extraout_var;
  long *plVar9;
  _Tuple_impl<3UL,_(anonymous_namespace)::QuantType,_aom_bit_depth> *p_Var10;
  ostream *poVar11;
  size_type sVar12;
  aom_bit_depth *value;
  undefined4 extraout_var_01;
  undefined4 *puVar13;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  pointer psVar14;
  size_type index;
  ulong uVar15;
  bool bVar16;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_330;
  char *local_328;
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::TestInfo>
  test_info;
  size_t local_310;
  string param_name;
  ParamGenerator<std::tuple<void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>
  generator;
  string test_suite_name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  char *local_270 [4];
  string local_250;
  CodeLocation local_230;
  undefined4 local_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  undefined4 local_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  CodeLocation local_1e0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  size_t local_198;
  long *plVar8;
  undefined4 extraout_var_00;
  
  psVar14 = (this->tests_).
            super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::TestInfo>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  bVar16 = false;
  do {
    if (psVar14 ==
        (this->tests_).
        super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::TestInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      if (!bVar16) {
        iVar7 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase
                  [2])(this);
        CodeLocation::CodeLocation(&local_1e0,&this->code_location_);
        InsertSyntheticTestCase
                  ((string *)CONCAT44(extraout_var_03,iVar7),&local_1e0,
                   (this->tests_).
                   super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::TestInfo>_>_>
                   ._M_impl.super__Vector_impl_data._M_start !=
                   (this->tests_).
                   super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::TestInfo>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        std::__cxx11::string::~string((string *)&local_1e0);
      }
      return;
    }
    test_info.
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (psVar14->
              super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count
              (&test_info.
                super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,
               &(psVar14->
                super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                )._M_refcount);
    for (__lhs = (this->instantiations_).
                 super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::InstantiationInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        __lhs != (this->instantiations_).
                 super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::InstantiationInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish; __lhs = __lhs + 1) {
      (*__lhs->generator)(&generator);
      pPVar1 = __lhs->name_func;
      local_328 = __lhs->file;
      iVar7 = __lhs->line;
      test_suite_name._M_dataplus._M_p = (pointer)&test_suite_name.field_2;
      test_suite_name._M_string_length = 0;
      test_suite_name.field_2._M_local_buf[0] = '\0';
      if ((__lhs->name)._M_string_length != 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b8,&__lhs->name,"/");
        std::__cxx11::string::operator=((string *)&test_suite_name,(string *)local_1b8);
        std::__cxx11::string::~string((string *)local_1b8);
      }
      std::__cxx11::string::append((string *)&test_suite_name);
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &test_param_names._M_t._M_impl.super__Rb_tree_header._M_header;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      iVar5 = (*(generator.impl_.
                 super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->_vptr_ParamGeneratorInterface[2])();
      plVar8 = (long *)CONCAT44(extraout_var,iVar5);
      local_310 = 0;
      while( true ) {
        iVar5 = (*(generator.impl_.
                   super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->_vptr_ParamGeneratorInterface[3])();
        plVar9 = (long *)CONCAT44(extraout_var_00,iVar5);
        if (plVar8 == plVar9) {
          bVar3 = 0;
        }
        else {
          bVar3 = (**(code **)(*plVar8 + 0x30))(plVar8,plVar9);
          bVar3 = bVar3 ^ 1;
        }
        if (plVar9 != (long *)0x0) {
          (**(code **)(*plVar9 + 8))(plVar9);
        }
        if (bVar3 == 0) break;
        Message::Message((Message *)&local_330);
        p_Var10 = (_Tuple_impl<3UL,_(anonymous_namespace)::QuantType,_aom_bit_depth> *)
                  (**(code **)(*plVar8 + 0x28))();
        local_1b8._0_8_ = *p_Var10;
        local_1b8._8_8_ = p_Var10[1];
        local_1a8._M_allocated_capacity = (size_type)p_Var10[2];
        local_1a8._8_8_ = p_Var10[3];
        local_198 = local_310;
        (*pPVar1)(&param_name,
                  (TestParamInfo<std::tuple<void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>
                   *)local_1b8);
        if (param_name._M_string_length == 0) {
          bVar16 = false;
        }
        else {
          for (uVar15 = 0; bVar16 = param_name._M_string_length <= uVar15, !bVar16;
              uVar15 = uVar15 + 1) {
            bVar4 = IsAlNum(param_name._M_dataplus._M_p[uVar15]);
            if ((!bVar4) && (param_name._M_dataplus._M_p[uVar15] != '_')) break;
          }
        }
        bVar16 = IsTrue(bVar16);
        if (!bVar16) {
          GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-param-util.h"
                             ,0x246);
          poVar11 = std::operator<<((ostream *)&std::cerr,
                                    "Condition IsValidParamName(param_name) failed. ");
          poVar11 = std::operator<<(poVar11,"Parameterized test name \'");
          poVar11 = std::operator<<(poVar11,(string *)&param_name);
          poVar11 = std::operator<<(poVar11,"\' is invalid, in ");
          poVar11 = std::operator<<(poVar11,local_328);
          poVar11 = std::operator<<(poVar11," line ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar7);
          std::endl<char,std::char_traits<char>>(poVar11);
          GTestLog::~GTestLog((GTestLog *)local_1b8);
        }
        sVar12 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::count(&test_param_names,&param_name);
        bVar16 = IsTrue(sVar12 == 0);
        if (!bVar16) {
          GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-param-util.h"
                             ,0x24a);
          poVar11 = std::operator<<((ostream *)&std::cerr,
                                    "Condition test_param_names.count(param_name) == 0 failed. ");
          poVar11 = std::operator<<(poVar11,"Duplicate parameterized test name \'");
          poVar11 = std::operator<<(poVar11,(string *)&param_name);
          poVar11 = std::operator<<(poVar11,"\', in ");
          poVar11 = std::operator<<(poVar11,local_328);
          poVar11 = std::operator<<(poVar11," line ");
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar7);
          std::endl<char,std::char_traits<char>>(poVar11);
          GTestLog::~GTestLog((GTestLog *)local_1b8);
        }
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&test_param_names,&param_name);
        if (((test_info.
              super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->test_base_name)._M_string_length != 0) {
          std::operator<<((ostream *)(local_330._M_head_impl + 0x10),
                          (string *)
                          &(test_info.
                            super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->test_base_name);
          std::operator<<((ostream *)(local_330._M_head_impl + 0x10),"/");
        }
        std::operator<<((ostream *)(local_330._M_head_impl + 0x10),(string *)&param_name);
        test_suite_name_00 = test_suite_name._M_dataplus;
        Message::GetString_abi_cxx11_(&local_250,(Message *)&local_330);
        name._M_p = local_250._M_dataplus._M_p;
        value = (aom_bit_depth *)(**(code **)(*plVar8 + 0x28))();
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::operator<<((ostream *)local_1a8._M_local_buf,"(");
        PrintWithFallback<void(*)(int_const*,long,short_const*,short_const*,short_const*,short_const*,int*,int*,short_const*,unsigned_short*,short_const*,short_const*)>
                  ((_func_void_int_ptr_long_short_ptr_short_ptr_short_ptr_short_ptr_int_ptr_int_ptr_short_ptr_unsigned_short_ptr_short_ptr_short_ptr
                    **)(value + 6),(ostream *)local_1a8._M_local_buf);
        std::operator<<((ostream *)local_1a8._M_local_buf,", ");
        PrintWithFallback<void(*)(int_const*,long,short_const*,short_const*,short_const*,short_const*,int*,int*,short_const*,unsigned_short*,short_const*,short_const*)>
                  ((_func_void_int_ptr_long_short_ptr_short_ptr_short_ptr_short_ptr_int_ptr_int_ptr_short_ptr_unsigned_short_ptr_short_ptr_short_ptr
                    **)(value + 4),(ostream *)local_1a8._M_local_buf);
        std::operator<<((ostream *)local_1a8._M_local_buf,", ");
        UniversalPrinter<unsigned_char>::Print
                  ((uchar *)(value + 2),(ostream *)local_1a8._M_local_buf);
        std::operator<<((ostream *)local_1a8._M_local_buf,", ");
        UniversalPrinter<(anonymous_namespace)::QuantType>::Print
                  (value + 1,(ostream *)local_1a8._M_local_buf);
        std::operator<<((ostream *)local_1a8._M_local_buf,", ");
        internal_stream_operator_without_lexical_name_lookup::StreamPrinter::
        PrintValue<aom_bit_depth,void,std::ostream&>(value,(ostream *)local_1a8._M_local_buf);
        std::operator<<((ostream *)local_1a8._M_local_buf,")");
        std::__cxx11::stringbuf::str();
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        value_param = local_270[0];
        CodeLocation::CodeLocation
                  (&local_230,
                   &(test_info.
                     super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->code_location);
        iVar5 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase
                  [3])(this);
        bVar16 = IsTrue(true);
        if (!bVar16) {
          GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-internal.h"
                             ,0x20e);
          poVar11 = std::operator<<((ostream *)&std::cerr,
                                    "Condition !test_case_fp || !test_suite_fp failed. ");
          poVar11 = std::operator<<(poVar11,
                                    "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                                   );
          poVar11 = std::operator<<(poVar11,local_328);
          poVar11 = std::operator<<(poVar11,":");
          std::ostream::operator<<(poVar11,iVar7);
          GTestLog::~GTestLog((GTestLog *)local_1b8);
        }
        bVar16 = IsTrue(true);
        if (!bVar16) {
          GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-internal.h"
                             ,0x223);
          poVar11 = std::operator<<((ostream *)&std::cerr,
                                    "Condition !test_case_fp || !test_suite_fp failed. ");
          poVar11 = std::operator<<(poVar11,
                                    "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                                   );
          poVar11 = std::operator<<(poVar11,local_328);
          poVar11 = std::operator<<(poVar11,":");
          std::ostream::operator<<(poVar11,iVar7);
          GTestLog::~GTestLog((GTestLog *)local_1b8);
        }
        pTVar2 = ((test_info.
                   super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->test_meta_factory)._M_t.
                 super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<std::tuple<void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>_>_>
                 .
                 super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>_*,_false>
                 ._M_head_impl;
        puVar13 = (undefined4 *)(**(code **)(*plVar8 + 0x28))();
        local_208 = *puVar13;
        uStack_204 = puVar13[1];
        uStack_200 = puVar13[2];
        uStack_1fc = puVar13[3];
        local_1f8 = puVar13[4];
        uStack_1f4 = puVar13[5];
        uStack_1f0 = puVar13[6];
        uStack_1ec = puVar13[7];
        iVar6 = (*pTVar2->_vptr_TestMetaFactoryBase[2])(pTVar2,&local_208);
        MakeAndRegisterTestInfo
                  (test_suite_name_00._M_p,name._M_p,(char *)0x0,value_param,&local_230,
                   (TypeId)CONCAT44(extraout_var_01,iVar5),(SetUpTestSuiteFunc)0x0,
                   (TearDownTestSuiteFunc)0x0,(TestFactoryBase *)CONCAT44(extraout_var_02,iVar6));
        std::__cxx11::string::~string((string *)&local_230);
        std::__cxx11::string::~string((string *)local_270);
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::~string((string *)&param_name);
        if (local_330._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_330._M_head_impl + 8))();
        }
        (**(code **)(*plVar8 + 0x18))();
        local_310 = local_310 + 1;
        bVar16 = true;
      }
      if (plVar8 != (long *)0x0) {
        (**(code **)(*plVar8 + 8))();
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&test_param_names._M_t);
      std::__cxx11::string::~string((string *)&test_suite_name);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&generator.impl_.
                  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&test_info.
                super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    psVar14 = psVar14 + 1;
  } while( true );
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    for (typename TestInfoContainer::iterator test_it = tests_.begin();
         test_it != tests_.end(); ++test_it) {
      std::shared_ptr<TestInfo> test_info = *test_it;
      for (typename InstantiationContainer::iterator gen_it =
               instantiations_.begin();
           gen_it != instantiations_.end(); ++gen_it) {
        const std::string& instantiation_name = gen_it->name;
        ParamGenerator<ParamType> generator((*gen_it->generator)());
        ParamNameGeneratorFunc* name_func = gen_it->name_func;
        const char* file = gen_it->file;
        int line = gen_it->line;

        std::string test_suite_name;
        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        test_suite_name += test_info->test_suite_base_name;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (typename ParamGenerator<ParamType>::iterator param_it =
                 generator.begin();
             param_it != generator.end(); ++param_it, ++i) {
          generated_instantiations = true;

          Message test_name_stream;

          std::string param_name =
              name_func(TestParamInfo<ParamType>(*param_it, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid, in " << file << " line " << line << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          test_param_names.insert(param_name);

          if (!test_info->test_base_name.empty()) {
            test_name_stream << test_info->test_base_name << "/";
          }
          test_name_stream << param_name;
          MakeAndRegisterTestInfo(
              test_suite_name.c_str(), test_name_stream.GetString().c_str(),
              nullptr,  // No type parameter.
              PrintToString(*param_it).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(*param_it));
        }  // for param_it
      }    // for gen_it
    }      // for test_it

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }